

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_> *
Scene::GetVertexAttributeDescriptions(void)

{
  reference pvVar1;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  *in_RDI;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_> *ret
  ;
  allocator_type *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::allocator<VkVertexInputAttributeDescription>::allocator
            ((allocator<VkVertexInputAttributeDescription> *)0x139339);
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)CONCAT17(uVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
           in_stack_ffffffffffffffe0);
  std::allocator<VkVertexInputAttributeDescription>::~allocator
            ((allocator<VkVertexInputAttributeDescription> *)&stack0xfffffffffffffff6);
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,0);
  pvVar1->binding = 0;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,0);
  pvVar1->location = 0;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,0);
  pvVar1->format = VK_FORMAT_R32G32B32_SFLOAT;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,0);
  pvVar1->offset = 0;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,1);
  pvVar1->binding = 0;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,1);
  pvVar1->location = 1;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,1);
  pvVar1->format = VK_FORMAT_R32G32_SFLOAT;
  pvVar1 = std::
           vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ::operator[](in_RDI,1);
  pvVar1->offset = 0xc;
  return in_RDI;
}

Assistant:

std::vector<VkVertexInputAttributeDescription> Scene::GetVertexAttributeDescriptions() {
	std::vector<VkVertexInputAttributeDescription> ret(2);
	ret[0].binding = 0;
	ret[0].location = 0;
	ret[0].format = VK_FORMAT_R32G32B32_SFLOAT;
	ret[0].offset = offsetof(Vertex, m_position);

	ret[1].binding = 0;
	ret[1].location = 1;
	ret[1].format = VK_FORMAT_R32G32_SFLOAT;
	ret[1].offset = offsetof(Vertex, m_texcoord);

	return ret;
}